

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block_splitter.cc
# Opt level: O1

void brotli::ClusterBlocks<brotli::Histogram<704>,unsigned_short>
               (unsigned_short *data,size_t length,uint8_t *block_ids)

{
  uint8_t uVar1;
  uint8_t uVar2;
  pointer pHVar3;
  uint uVar4;
  size_t sVar5;
  vector<brotli::Histogram<704>,_std::allocator<brotli::Histogram<704>_>_> histograms;
  vector<unsigned_int,_std::allocator<unsigned_int>_> block_index;
  vector<unsigned_int,_std::allocator<unsigned_int>_> histogram_symbols;
  vector<brotli::Histogram<704>,_std::allocator<brotli::Histogram<704>_>_> clustered_histograms;
  Histogram<704> cur_histogram;
  vector<brotli::Histogram<704>,_std::allocator<brotli::Histogram<704>_>_> local_bb8;
  unsigned_short *local_b98;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_b90;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_b78;
  size_t local_b60;
  vector<brotli::Histogram<704>,_std::allocator<brotli::Histogram<704>_>_> local_b58;
  Histogram<704> local_b40;
  
  local_bb8.super__Vector_base<brotli::Histogram<704>,_std::allocator<brotli::Histogram<704>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_bb8.super__Vector_base<brotli::Histogram<704>,_std::allocator<brotli::Histogram<704>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (Histogram<704> *)0x0;
  local_bb8.super__Vector_base<brotli::Histogram<704>,_std::allocator<brotli::Histogram<704>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (Histogram<704> *)0x0;
  local_b98 = data;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&local_b90,length,(allocator_type *)&local_b40);
  uVar4 = 0;
  memset(&local_b40,0,0xb08);
  local_b40.bit_cost_ = INFINITY;
  if (length != 0) {
    local_b60 = length - 1;
    sVar5 = 0;
    do {
      pHVar3 = local_bb8.
               super__Vector_base<brotli::Histogram<704>,_std::allocator<brotli::Histogram<704>_>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      if (local_b60 == sVar5) {
        local_b90.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start[sVar5] = uVar4;
        local_b40.data_[local_b98[sVar5]] = local_b40.data_[local_b98[sVar5]] + 1;
        local_b40.total_count_ = local_b40.total_count_ + 1;
LAB_00174c08:
        if (local_bb8.
            super__Vector_base<brotli::Histogram<704>,_std::allocator<brotli::Histogram<704>_>_>.
            _M_impl.super__Vector_impl_data._M_finish ==
            local_bb8.
            super__Vector_base<brotli::Histogram<704>,_std::allocator<brotli::Histogram<704>_>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<brotli::Histogram<704>,std::allocator<brotli::Histogram<704>>>::
          _M_realloc_insert<brotli::Histogram<704>const&>
                    ((vector<brotli::Histogram<704>,std::allocator<brotli::Histogram<704>>> *)
                     &local_bb8,
                     (iterator)
                     local_bb8.
                     super__Vector_base<brotli::Histogram<704>,_std::allocator<brotli::Histogram<704>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish,&local_b40);
        }
        else {
          memcpy(local_bb8.
                 super__Vector_base<brotli::Histogram<704>,_std::allocator<brotli::Histogram<704>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish,&local_b40,0xb10);
          local_bb8.
          super__Vector_base<brotli::Histogram<704>,_std::allocator<brotli::Histogram<704>_>_>.
          _M_impl.super__Vector_impl_data._M_finish = pHVar3 + 1;
        }
        memset(&local_b40,0,0xb08);
        local_b40.bit_cost_ = INFINITY;
        uVar4 = uVar4 + 1;
      }
      else {
        uVar1 = block_ids[sVar5];
        uVar2 = block_ids[sVar5 + 1];
        local_b90.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start[sVar5] = uVar4;
        local_b40.data_[local_b98[sVar5]] = local_b40.data_[local_b98[sVar5]] + 1;
        local_b40.total_count_ = local_b40.total_count_ + 1;
        if (uVar1 != uVar2) goto LAB_00174c08;
      }
      sVar5 = sVar5 + 1;
    } while (length != sVar5);
  }
  local_b58.super__Vector_base<brotli::Histogram<704>,_std::allocator<brotli::Histogram<704>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_b58.super__Vector_base<brotli::Histogram<704>,_std::allocator<brotli::Histogram<704>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_b58.super__Vector_base<brotli::Histogram<704>,_std::allocator<brotli::Histogram<704>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_b78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_b78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_b78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  ClusterHistograms<brotli::Histogram<704>>
            (&local_bb8,1,
             ((long)local_bb8.
                    super__Vector_base<brotli::Histogram<704>,_std::allocator<brotli::Histogram<704>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)local_bb8.
                    super__Vector_base<brotli::Histogram<704>,_std::allocator<brotli::Histogram<704>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 4) * 0x43fa36f5e02e4851,0x100,
             &local_b58,&local_b78);
  if (length != 0) {
    sVar5 = 0;
    do {
      block_ids[sVar5] =
           (uint8_t)local_b78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start
                    [local_b90.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_start[sVar5]];
      sVar5 = sVar5 + 1;
    } while (length != sVar5);
  }
  if (local_b78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_b78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_b78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_b78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_b58.super__Vector_base<brotli::Histogram<704>,_std::allocator<brotli::Histogram<704>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_b58.
                    super__Vector_base<brotli::Histogram<704>,_std::allocator<brotli::Histogram<704>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_b58.
                          super__Vector_base<brotli::Histogram<704>,_std::allocator<brotli::Histogram<704>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_b58.
                          super__Vector_base<brotli::Histogram<704>,_std::allocator<brotli::Histogram<704>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_b90.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_b90.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_b90.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_b90.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_bb8.super__Vector_base<brotli::Histogram<704>,_std::allocator<brotli::Histogram<704>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_bb8.
                    super__Vector_base<brotli::Histogram<704>,_std::allocator<brotli::Histogram<704>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_bb8.
                          super__Vector_base<brotli::Histogram<704>,_std::allocator<brotli::Histogram<704>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_bb8.
                          super__Vector_base<brotli::Histogram<704>,_std::allocator<brotli::Histogram<704>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void ClusterBlocks(const DataType* data, const size_t length,
                   uint8_t* block_ids) {
  std::vector<HistogramType> histograms;
  std::vector<uint32_t> block_index(length);
  uint32_t cur_idx = 0;
  HistogramType cur_histogram;
  for (size_t i = 0; i < length; ++i) {
    bool block_boundary = (i + 1 == length || block_ids[i] != block_ids[i + 1]);
    block_index[i] = cur_idx;
    cur_histogram.Add(data[i]);
    if (block_boundary) {
      histograms.push_back(cur_histogram);
      cur_histogram.Clear();
      ++cur_idx;
    }
  }
  std::vector<HistogramType> clustered_histograms;
  std::vector<uint32_t> histogram_symbols;
  // Block ids need to fit in one byte.
  static const size_t kMaxNumberOfBlockTypes = 256;
  ClusterHistograms(histograms, 1, histograms.size(),
                    kMaxNumberOfBlockTypes,
                    &clustered_histograms,
                    &histogram_symbols);
  for (size_t i = 0; i < length; ++i) {
    block_ids[i] = static_cast<uint8_t>(histogram_symbols[block_index[i]]);
  }
}